

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O1

void EbIb(PDISASM pMyDisasm)

{
  ulong uVar1;
  ulong uVar2;
  
  (pMyDisasm->Operand2).OpType = 0x8040000;
  (pMyDisasm->Operand2).OpSize = 8;
  (pMyDisasm->Reserved_).ImmediatSize = 8;
  (pMyDisasm->Reserved_).OperandSize = 8;
  (pMyDisasm->Reserved_).MemDecoration = 1;
  decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).OperandSize = 0x20;
  uVar2 = (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 3) + (pMyDisasm->Reserved_).EIP_;
  (pMyDisasm->Reserved_).EIP_ = uVar2;
  uVar1 = (pMyDisasm->Reserved_).EndOfBlock;
  if ((uVar1 == 0) || (uVar2 <= uVar1)) {
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.2X",(long)*(char *)(uVar2 - 1)
                       );
    (pMyDisasm->Instruction).Immediat = (ulong)*(byte *)((pMyDisasm->Reserved_).EIP_ - 1);
  }
  else {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
  }
  return;
}

Assistant:

void __bea_callspec__ EbIb(PDISASM pMyDisasm)
{
  pMyDisasm->Operand2.OpType = CONSTANT_TYPE+ABSOLUTE_;
  pMyDisasm->Operand2.OpSize = 8;
  GV.ImmediatSize = 8;
  GV.MemDecoration = Arg1byte;
  GV.OperandSize = 8;
  decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
  GV.OperandSize = 32;
  GV.EIP_ += GV.DECALAGE_EIP+3;
  if (!Security(0, pMyDisasm)) return;
  #ifndef BEA_LIGHT_DISASSEMBLY
    (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.2X",(Int64)*((Int8*) (GV.EIP_-1)));
  #endif
  pMyDisasm->Instruction.Immediat = *((UInt8*) (GV.EIP_-1));
}